

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void lexer_backtrace(void)

{
  c = bc;
  l = bl;
  prev = bprev;
  line = bline;
  column = bcolumn;
  fseek((FILE *)f,(ulong)bseek,0);
  return;
}

Assistant:

void lexer_backtrace()
{
    c = bc;
    l = bl;
    prev = bprev;
    line = bline;
    column = bcolumn;
    fseek(f, bseek, SEEK_SET);
}